

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O2

void __thiscall xmrig::CpuBackend::start(CpuBackend *this,IWorker *worker,bool ready)

{
  bool bVar1;
  
  std::mutex::lock((mutex *)mutex);
  bVar1 = CpuLaunchStatus::started(&this->d_ptr->status,worker,ready);
  if (bVar1) {
    CpuLaunchStatus::print(&this->d_ptr->status);
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex);
  if (ready) {
    (*worker->_vptr_IWorker[8])(worker);
    return;
  }
  return;
}

Assistant:

void xmrig::CpuBackend::start(IWorker *worker, bool ready)
{
    mutex.lock();

    if (d_ptr->status.started(worker, ready)) {
        d_ptr->status.print();
    }

    mutex.unlock();

    if (ready) {
        worker->start();
    }
}